

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void CalcResizePosSizeFromAnyCorner
               (ImGuiWindow *window,ImVec2 *corner_target,ImVec2 *corner_norm,ImVec2 *out_pos,
               ImVec2 *out_size)

{
  ImVec2 IVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar7 [16];
  undefined1 extraout_var [56];
  
  auVar3 = vinsertps_avx(in_ZMM0._0_16_,in_ZMM1._0_16_,0x10);
  IVar1 = window->Pos;
  auVar5._8_8_ = 0;
  auVar5._0_4_ = IVar1.x;
  auVar5._4_4_ = IVar1.y;
  auVar7._8_8_ = 0;
  auVar7._0_4_ = corner_target->x;
  auVar7._4_4_ = corner_target->y;
  auVar5 = vsubps_avx(auVar5,auVar3);
  auVar6._0_4_ = IVar1.x + (window->Size).x;
  auVar6._4_4_ = IVar1.y + (window->Size).y;
  auVar6._8_8_ = 0;
  auVar5 = vfmadd213ps_fma(auVar5,auVar7,auVar3);
  auVar3 = vsubps_avx(auVar3,auVar6);
  auVar3 = vfmadd213ps_fma(auVar3,auVar7,auVar6);
  auVar3 = vsubps_avx(auVar3,auVar5);
  auVar4._0_8_ = CalcWindowSizeAfterConstraint(window,auVar3._0_8_);
  auVar4._8_56_ = extraout_var;
  IVar1 = (ImVec2)vmovlps_avx(auVar5);
  *corner_norm = IVar1;
  if ((corner_target->x == 0.0) && (!NAN(corner_target->x))) {
    corner_norm->x = auVar5._0_4_ - (auVar4._0_4_ - auVar3._0_4_);
  }
  if ((corner_target->y == 0.0) && (!NAN(corner_target->y))) {
    auVar3 = vsubps_avx(auVar4._0_16_,auVar3);
    auVar3 = vsubps_avx(auVar5,auVar3);
    fVar2 = (float)vextractps_avx(auVar3,1);
    corner_norm->y = fVar2;
  }
  IVar1 = (ImVec2)vmovlpd_avx(auVar4._0_16_);
  *out_pos = IVar1;
  return;
}

Assistant:

static void CalcResizePosSizeFromAnyCorner(ImGuiWindow* window, const ImVec2& corner_target, const ImVec2& corner_norm, ImVec2* out_pos, ImVec2* out_size)
{
    ImVec2 pos_min = ImLerp(corner_target, window->Pos, corner_norm);                // Expected window upper-left
    ImVec2 pos_max = ImLerp(window->Pos + window->Size, corner_target, corner_norm); // Expected window lower-right
    ImVec2 size_expected = pos_max - pos_min;
    ImVec2 size_constrained = CalcWindowSizeAfterConstraint(window, size_expected);
    *out_pos = pos_min;
    if (corner_norm.x == 0.0f)
        out_pos->x -= (size_constrained.x - size_expected.x);
    if (corner_norm.y == 0.0f)
        out_pos->y -= (size_constrained.y - size_expected.y);
    *out_size = size_constrained;
}